

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void set_txfm_context(MACROBLOCKD *xd,TX_SIZE tx_size,int blk_row,int blk_col)

{
  BLOCK_SIZE bsize_00;
  int iVar1;
  MB_MODE_INFO *pMVar2;
  int iVar3;
  int in_ECX;
  int in_EDX;
  undefined1 in_SIL;
  MACROBLOCKD *in_RDI;
  int offsetc;
  int col;
  int offsetr;
  int row;
  int col_end;
  int row_end;
  int bsh;
  int bsw;
  TX_SIZE sub_txs;
  TX_SIZE plane_tx_size;
  int txb_size_index;
  int max_blocks_wide;
  int max_blocks_high;
  BLOCK_SIZE bsize;
  MB_MODE_INFO *mbmi;
  int local_5c;
  int local_58;
  int local_50;
  int local_48;
  int in_stack_ffffffffffffffe8;
  undefined3 in_stack_fffffffffffffff4;
  undefined4 uVar4;
  byte tx_size_00;
  
  uVar4 = CONCAT13(in_SIL,in_stack_fffffffffffffff4);
  pMVar2 = *in_RDI->mi;
  bsize_00 = pMVar2->bsize;
  local_58 = max_block_high(in_RDI,bsize_00,0);
  local_5c = max_block_wide(in_RDI,bsize_00,0);
  iVar3 = av1_get_txb_size_index(bsize_00,in_EDX,in_ECX);
  if ((in_EDX < local_58) && (in_ECX < local_5c)) {
    tx_size_00 = (byte)((uint)uVar4 >> 0x18);
    if (tx_size_00 == pMVar2->inter_tx_size[iVar3]) {
      pMVar2->tx_size = tx_size_00;
      txfm_partition_update
                (in_RDI->above_txfm_context + in_ECX,in_RDI->left_txfm_context + in_EDX,tx_size_00,
                 tx_size_00);
    }
    else if (tx_size_00 == 1) {
      pMVar2->inter_tx_size[iVar3] = '\0';
      pMVar2->tx_size = '\0';
      txfm_partition_update
                (in_RDI->above_txfm_context + in_ECX,in_RDI->left_txfm_context + in_EDX,'\0','\x01')
      ;
    }
    else {
      iVar3 = tx_size_wide_unit[""[tx_size_00]];
      iVar1 = tx_size_high_unit[""[tx_size_00]];
      if (tx_size_high_unit[tx_size_00] < local_58 - in_EDX) {
        local_58 = tx_size_high_unit[tx_size_00];
      }
      else {
        local_58 = local_58 - in_EDX;
      }
      if (tx_size_wide_unit[tx_size_00] < local_5c - in_ECX) {
        local_5c = tx_size_wide_unit[tx_size_00];
      }
      else {
        local_5c = local_5c - in_ECX;
      }
      for (local_48 = 0; local_48 < local_58; local_48 = iVar1 + local_48) {
        for (local_50 = 0; local_50 < local_5c; local_50 = iVar3 + local_50) {
          set_txfm_context((MACROBLOCKD *)CONCAT44(uVar4,in_EDX),(TX_SIZE)((uint)in_ECX >> 0x18),
                           in_stack_ffffffffffffffe8,(int)((ulong)pMVar2 >> 0x20));
        }
      }
    }
  }
  return;
}

Assistant:

static void set_txfm_context(MACROBLOCKD *xd, TX_SIZE tx_size, int blk_row,
                             int blk_col) {
  MB_MODE_INFO *mbmi = xd->mi[0];
  const BLOCK_SIZE bsize = mbmi->bsize;
  const int max_blocks_high = max_block_high(xd, bsize, 0);
  const int max_blocks_wide = max_block_wide(xd, bsize, 0);
  const int txb_size_index = av1_get_txb_size_index(bsize, blk_row, blk_col);
  const TX_SIZE plane_tx_size = mbmi->inter_tx_size[txb_size_index];

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;

  if (tx_size == plane_tx_size) {
    mbmi->tx_size = tx_size;
    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);

  } else {
    if (tx_size == TX_8X8) {
      mbmi->inter_tx_size[txb_size_index] = TX_4X4;
      mbmi->tx_size = TX_4X4;
      txfm_partition_update(xd->above_txfm_context + blk_col,
                            xd->left_txfm_context + blk_row, TX_4X4, tx_size);
      return;
    }
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];
    const int row_end =
        AOMMIN(tx_size_high_unit[tx_size], max_blocks_high - blk_row);
    const int col_end =
        AOMMIN(tx_size_wide_unit[tx_size], max_blocks_wide - blk_col);
    for (int row = 0; row < row_end; row += bsh) {
      const int offsetr = blk_row + row;
      for (int col = 0; col < col_end; col += bsw) {
        const int offsetc = blk_col + col;
        set_txfm_context(xd, sub_txs, offsetr, offsetc);
      }
    }
  }
}